

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

value * __thiscall mjs::regexp_object::get_source(value *__return_storage_ptr__,regexp_object *this)

{
  gc_heap_ptr_untyped local_30;
  gc_heap *local_20;
  uint32_t local_18;
  
  gc_heap::unsafe_create_from_position<mjs::gc_string>
            ((gc_heap *)&stack0xffffffffffffffe0,
             (uint32_t)(this->super_native_object).super_object.heap_);
  local_30.heap_ = local_20;
  local_30.pos_ = local_18;
  if (local_20 == (gc_heap *)0x0) {
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).n_ = 0.0;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_18;
  }
  else {
    gc_heap::attach(local_20,&local_30);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_30.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_30.pos_;
    if (local_30.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_30.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value get_source() const {
        return value{source_.track(heap())};
    }